

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O2

void SetMTChecksum(uchar *msg,int msglen)

{
  char cVar1;
  long lVar2;
  
  cVar1 = '\0';
  for (lVar2 = 1; lVar2 < (long)msglen + -1; lVar2 = lVar2 + 1) {
    cVar1 = cVar1 + msg[lVar2];
  }
  msg[(long)msglen + -1] = -cVar1;
  return;
}

Assistant:

inline void SetMTChecksum(unsigned char* msg, int msglen)
{
	int i = 0;
	uInt_MT checksum;

	// If all message bytes excluding the preamble are summed and the lower byte value 
	// of the result equals zero, the message is valid and it may be processed. The 
	// checksum value of the message should be included in the summation.
	checksum.v = 0;
	for (i = 1; i < msglen-1; i++)
	{
		checksum.v += msg[i];
	}
	msg[msglen-1] = (unsigned char)(256-(int)checksum.c[0]);
}